

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O3

void __thiscall
cmLocalGenerator::AddLanguageFlags
          (cmLocalGenerator *this,string *flags,cmGeneratorTarget *target,string *lang,
          string *config)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  cmMakefile *pcVar4;
  pointer pcVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  char *pcVar9;
  string *psVar10;
  long *plVar11;
  size_type *psVar12;
  ulong *puVar13;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var14;
  long *plVar15;
  byte bVar16;
  string local_168;
  string msvcRuntimeLibrary;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  string *local_108;
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_> cge
  ;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  string flagsVar;
  long *local_b8;
  long local_b0;
  long local_a8;
  long lStack_a0;
  cmGeneratorExpression ge;
  cmListFileBacktrace local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  flagsVar._M_dataplus._M_p = (pointer)&flagsVar.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&flagsVar,"CMAKE_","");
  local_108 = lang;
  std::__cxx11::string::_M_append((char *)&flagsVar,(ulong)(lang->_M_dataplus)._M_p);
  std::__cxx11::string::append((char *)&flagsVar);
  AddConfigVariableFlags(this,flags,&flagsVar,config);
  pcVar4 = this->Makefile;
  msvcRuntimeLibrary._M_dataplus._M_p = (pointer)&msvcRuntimeLibrary.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&msvcRuntimeLibrary,"CMAKE_MSVC_RUNTIME_LIBRARY_DEFAULT","");
  pcVar9 = cmMakefile::GetDefinition(pcVar4,&msvcRuntimeLibrary);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)msvcRuntimeLibrary._M_dataplus._M_p != &msvcRuntimeLibrary.field_2) {
    operator_delete(msvcRuntimeLibrary._M_dataplus._M_p,
                    msvcRuntimeLibrary.field_2._M_allocated_capacity + 1);
  }
  if ((pcVar9 == (char *)0x0) || (*pcVar9 == '\0')) goto LAB_0016c17d;
  msvcRuntimeLibrary._M_dataplus._M_p = (pointer)&msvcRuntimeLibrary.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&msvcRuntimeLibrary,"MSVC_RUNTIME_LIBRARY","");
  cmGeneratorTarget::GetProperty(target,&msvcRuntimeLibrary);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)msvcRuntimeLibrary._M_dataplus._M_p != &msvcRuntimeLibrary.field_2) {
    operator_delete(msvcRuntimeLibrary._M_dataplus._M_p,
                    msvcRuntimeLibrary.field_2._M_allocated_capacity + 1);
  }
  local_88.TopEntry.super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  local_88.TopEntry.super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  cmGeneratorExpression::cmGeneratorExpression(&ge,&local_88);
  if (local_88.TopEntry.
      super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_88.TopEntry.
               super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  cmGeneratorExpression::Parse((cmGeneratorExpression *)&cge,(char *)&ge);
  paVar1 = &local_168.field_2;
  local_168._M_string_length = 0;
  local_168.field_2._M_allocated_capacity =
       local_168.field_2._M_allocated_capacity & 0xffffffffffffff00;
  local_168._M_dataplus._M_p = (pointer)paVar1;
  psVar10 = cmCompiledGeneratorExpression::Evaluate
                      ((cmCompiledGeneratorExpression *)
                       cge._M_t.
                       super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
                       .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl,
                       this,config,false,target,(cmGeneratorTarget *)0x0,
                       (cmGeneratorExpressionDAGChecker *)0x0,&local_168);
  msvcRuntimeLibrary._M_dataplus._M_p = (pointer)&msvcRuntimeLibrary.field_2;
  pcVar5 = (psVar10->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&msvcRuntimeLibrary,pcVar5,pcVar5 + psVar10->_M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168._M_dataplus._M_p != paVar1) {
    operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
  }
  if (msvcRuntimeLibrary._M_string_length != 0) {
    pcVar4 = this->Makefile;
    std::operator+(&local_f8,"CMAKE_",local_108);
    plVar11 = (long *)std::__cxx11::string::append((char *)&local_f8);
    paVar2 = &local_128.field_2;
    psVar12 = (size_type *)(plVar11 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar11 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar12) {
      local_128.field_2._M_allocated_capacity = *psVar12;
      local_128.field_2._8_8_ = plVar11[3];
      local_128._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_128.field_2._M_allocated_capacity = *psVar12;
      local_128._M_dataplus._M_p = (pointer)*plVar11;
    }
    local_128._M_string_length = plVar11[1];
    *plVar11 = (long)psVar12;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    plVar11 = (long *)std::__cxx11::string::_M_append
                                ((char *)&local_128,(ulong)msvcRuntimeLibrary._M_dataplus._M_p);
    puVar13 = (ulong *)(plVar11 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar11 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar13) {
      local_168.field_2._M_allocated_capacity = *puVar13;
      local_168.field_2._8_8_ = plVar11[3];
      local_168._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_168.field_2._M_allocated_capacity = *puVar13;
      local_168._M_dataplus._M_p = (pointer)*plVar11;
    }
    local_168._M_string_length = plVar11[1];
    *plVar11 = (long)puVar13;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    pcVar9 = cmMakefile::GetDefinition(pcVar4,&local_168);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_168._M_dataplus._M_p != paVar1) {
      operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != paVar2) {
      operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
    }
    paVar3 = &local_f8.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != paVar3) {
      operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
    }
    if (pcVar9 == (char *)0x0) {
      pcVar4 = this->Makefile;
      std::operator+(&local_128,"CMAKE_",local_108);
      plVar11 = (long *)std::__cxx11::string::append((char *)&local_128);
      puVar13 = (ulong *)(plVar11 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar11 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar13) {
        local_168.field_2._M_allocated_capacity = *puVar13;
        local_168.field_2._8_8_ = plVar11[3];
        local_168._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_168.field_2._M_allocated_capacity = *puVar13;
        local_168._M_dataplus._M_p = (pointer)*plVar11;
      }
      local_168._M_string_length = plVar11[1];
      *plVar11 = (long)puVar13;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      psVar10 = cmMakefile::GetSafeDefinition(pcVar4,&local_168);
      iVar7 = std::__cxx11::string::compare((char *)psVar10);
      if (iVar7 == 0) {
LAB_0016beff:
        bVar6 = true;
        if ((cmSystemTools::s_ErrorOccured == false) &&
           (cmSystemTools::s_FatalErrorOccured == false)) {
          bVar6 = cmSystemTools::GetInterruptFlag();
        }
        bVar16 = bVar6 ^ 1;
        if (iVar7 != 0) goto LAB_0016bf2d;
      }
      else {
        pcVar4 = this->Makefile;
        std::operator+(&local_50,"CMAKE_",local_108);
        plVar11 = (long *)std::__cxx11::string::append((char *)&local_50);
        p_Var14 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(plVar11 + 2);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*plVar11 == p_Var14) {
          local_f8.field_2._M_allocated_capacity = (size_type)p_Var14->_vptr__Sp_counted_base;
          local_f8.field_2._8_8_ = plVar11[3];
          local_f8._M_dataplus._M_p = (pointer)paVar3;
        }
        else {
          local_f8.field_2._M_allocated_capacity = (size_type)p_Var14->_vptr__Sp_counted_base;
          local_f8._M_dataplus._M_p = (pointer)*plVar11;
        }
        local_f8._M_string_length = plVar11[1];
        *plVar11 = (long)p_Var14;
        plVar11[1] = 0;
        *(undefined1 *)(plVar11 + 2) = 0;
        psVar10 = cmMakefile::GetSafeDefinition(pcVar4,&local_f8);
        iVar8 = std::__cxx11::string::compare((char *)psVar10);
        if (iVar8 == 0) goto LAB_0016beff;
        bVar16 = 0;
LAB_0016bf2d:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8._M_dataplus._M_p != paVar3) {
          operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_168._M_dataplus._M_p != paVar1) {
        operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128._M_dataplus._M_p != paVar2) {
        operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
      }
      if (bVar16 != 0) {
        std::operator+(&local_70,"MSVC_RUNTIME_LIBRARY value \'",&msvcRuntimeLibrary);
        plVar11 = (long *)std::__cxx11::string::append((char *)&local_70);
        plVar15 = plVar11 + 2;
        if ((long *)*plVar11 == plVar15) {
          local_a8 = *plVar15;
          lStack_a0 = plVar11[3];
          local_b8 = &local_a8;
        }
        else {
          local_a8 = *plVar15;
          local_b8 = (long *)*plVar11;
        }
        local_b0 = plVar11[1];
        *plVar11 = (long)plVar15;
        plVar11[1] = 0;
        *(undefined1 *)(plVar11 + 2) = 0;
        plVar11 = (long *)std::__cxx11::string::_M_append
                                    ((char *)&local_b8,(ulong)(local_108->_M_dataplus)._M_p);
        psVar12 = (size_type *)(plVar11 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar11 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar12) {
          local_128.field_2._M_allocated_capacity = *psVar12;
          local_128.field_2._8_8_ = plVar11[3];
          local_128._M_dataplus._M_p = (pointer)paVar2;
        }
        else {
          local_128.field_2._M_allocated_capacity = *psVar12;
          local_128._M_dataplus._M_p = (pointer)*plVar11;
        }
        local_128._M_string_length = plVar11[1];
        *plVar11 = (long)psVar12;
        plVar11[1] = 0;
        *(undefined1 *)(plVar11 + 2) = 0;
        plVar11 = (long *)std::__cxx11::string::append((char *)&local_128);
        puVar13 = (ulong *)(plVar11 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar11 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar13) {
          local_168.field_2._M_allocated_capacity = *puVar13;
          local_168.field_2._8_8_ = plVar11[3];
          local_168._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          local_168.field_2._M_allocated_capacity = *puVar13;
          local_168._M_dataplus._M_p = (pointer)*plVar11;
        }
        local_168._M_string_length = plVar11[1];
        *plVar11 = (long)puVar13;
        plVar11[1] = 0;
        *(undefined1 *)(plVar11 + 2) = 0;
        cmake::IssueMessage(this->GlobalGenerator->CMakeInstance,FATAL_ERROR,&local_168,
                            &this->DirectoryBacktrace);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_168._M_dataplus._M_p != paVar1) {
          operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_128._M_dataplus._M_p != paVar2) {
          operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
        }
        if (local_b8 != &local_a8) {
          operator_delete(local_b8,local_a8 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
      }
    }
    else {
      AppendCompileOptions(this,flags,pcVar9,(char *)0x0);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)msvcRuntimeLibrary._M_dataplus._M_p != &msvcRuntimeLibrary.field_2) {
    operator_delete(msvcRuntimeLibrary._M_dataplus._M_p,
                    msvcRuntimeLibrary.field_2._M_allocated_capacity + 1);
  }
  std::
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>::
  ~unique_ptr(&cge);
  cmGeneratorExpression::~cmGeneratorExpression(&ge);
LAB_0016c17d:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)flagsVar._M_dataplus._M_p != &flagsVar.field_2) {
    operator_delete(flagsVar._M_dataplus._M_p,flagsVar.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmLocalGenerator::AddLanguageFlags(std::string& flags,
                                        cmGeneratorTarget const* target,
                                        const std::string& lang,
                                        const std::string& config)
{
  // Add language-specific flags.
  std::string flagsVar = "CMAKE_";
  flagsVar += lang;
  flagsVar += "_FLAGS";
  this->AddConfigVariableFlags(flags, flagsVar, config);

  // Add MSVC runtime library flags.  This is activated by the presence
  // of a default selection whether or not it is overridden by a property.
  const char* msvcRuntimeLibraryDefault =
    this->Makefile->GetDefinition("CMAKE_MSVC_RUNTIME_LIBRARY_DEFAULT");
  if (msvcRuntimeLibraryDefault && *msvcRuntimeLibraryDefault) {
    const char* msvcRuntimeLibraryValue =
      target->GetProperty("MSVC_RUNTIME_LIBRARY");
    if (!msvcRuntimeLibraryValue) {
      msvcRuntimeLibraryValue = msvcRuntimeLibraryDefault;
    }
    cmGeneratorExpression ge;
    std::unique_ptr<cmCompiledGeneratorExpression> cge =
      ge.Parse(msvcRuntimeLibraryValue);
    std::string const msvcRuntimeLibrary =
      cge->Evaluate(this, config, false, target);
    if (!msvcRuntimeLibrary.empty()) {
      if (const char* msvcRuntimeLibraryOptions =
            this->Makefile->GetDefinition(
              "CMAKE_" + lang + "_COMPILE_OPTIONS_MSVC_RUNTIME_LIBRARY_" +
              msvcRuntimeLibrary)) {
        this->AppendCompileOptions(flags, msvcRuntimeLibraryOptions);
      } else if ((this->Makefile->GetSafeDefinition(
                    "CMAKE_" + lang + "_COMPILER_ID") == "MSVC" ||
                  this->Makefile->GetSafeDefinition(
                    "CMAKE_" + lang + "_SIMULATE_ID") == "MSVC") &&
                 !cmSystemTools::GetErrorOccuredFlag()) {
        // The compiler uses the MSVC ABI so it needs a known runtime library.
        this->IssueMessage(MessageType::FATAL_ERROR,
                           "MSVC_RUNTIME_LIBRARY value '" +
                             msvcRuntimeLibrary + "' not known for this " +
                             lang + " compiler.");
      }
    }
  }
}